

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O1

bool __thiscall deqp::gls::DrawTestSpec::valid(DrawTestSpec *this)

{
  ushort uVar1;
  uint uVar2;
  ApiType ctxType;
  DrawMethod DVar3;
  IndexType IVar4;
  uint uVar5;
  bool bVar6;
  bool *pbVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  pointer pAVar11;
  GLValue GVar12;
  
  uVar2 = *(uint *)((anonymous_namespace)::getMethodInfo(deqp::gls::DrawTestSpec::DrawMethod)::infos
                   + (long)(int)this->drawMethod * 6);
  uVar1 = *(ushort *)
           ((anonymous_namespace)::getMethodInfo(deqp::gls::DrawTestSpec::DrawMethod)::infos +
           (long)(int)this->drawMethod * 6 + 4);
  pAVar11 = (this->attribs).
            super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (int)((long)(this->attribs).
                      super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar11 >> 3) * -0x33333333
  ;
  if (0 < (int)uVar9) {
    ctxType.m_bits = (this->apiType).m_bits;
    uVar10 = (ulong)(uVar9 & 0x7fffffff);
    do {
      bVar6 = AttributeSpec::valid(pAVar11,ctxType);
      if (!bVar6) {
        return false;
      }
      pAVar11 = pAVar11 + 1;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  if ((uVar2 >> 0x10 & 1) != 0) {
    IVar4 = this->indexType;
    if (IVar4 == INDEXTYPE_INT) {
      GVar12 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_UNSIGNED_INT);
      uVar9 = GVar12.field_1._0_4_;
    }
    else if (IVar4 == INDEXTYPE_SHORT) {
      GVar12 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_UNSIGNED_SHORT);
      uVar9 = (uint)GVar12.field_1._0_2_;
    }
    else {
      uVar9 = 0;
      if (IVar4 == INDEXTYPE_BYTE) {
        GVar12 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_UNSIGNED_BYTE);
        uVar9 = (uint)GVar12.field_1._0_1_;
      }
    }
    uVar8 = this->indexMin;
    uVar5 = this->indexMax;
    if ((int)(uVar5 | uVar8) < 0 || (int)uVar5 < (int)uVar8) {
      return false;
    }
    if (uVar9 < uVar5 || uVar9 < uVar8) {
      return false;
    }
  }
  if ((((uVar2 >> 0x18 & 1) == 0) || (-1 < this->first)) &&
     ((uVar9 = (this->apiType).m_bits, uVar9 != 2 ||
      (((DVar3 = this->drawMethod, DVar3 == DRAWMETHOD_DRAWELEMENTS ||
        (DVar3 == DRAWMETHOD_DRAWARRAYS)) &&
       ((DVar3 != DRAWMETHOD_DRAWELEMENTS || (this->indexType < INDEXTYPE_INT)))))))) {
    if ((uVar1 & 0x100) != 0) {
      if ((this->indirectOffset & 3) != 0) {
        return false;
      }
      pAVar11 = (this->attribs).
                super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = (int)((long)(this->attribs).
                          super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar11 >> 3) *
              -0x33333333;
      if (0 < (int)uVar8) {
        uVar10 = (ulong)(uVar8 & 0x7fffffff);
        pbVar7 = &pAVar11->useDefaultAttribute;
        do {
          if ((*pbVar7 == false) && (*(Storage *)(pbVar7 + -0x1c) == STORAGE_USER)) {
            return false;
          }
          pbVar7 = pbVar7 + 0x28;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
    }
    if (this->drawMethod == DRAWMETHOD_DRAWELEMENTS_INDIRECT) {
      if (this->indexPointerOffset % indexTypeSize::size[(int)this->indexType] != 0) {
        return false;
      }
      if (this->indexStorage != STORAGE_BUFFER) {
        return false;
      }
    }
    if ((((uVar9 & 0x300) != 0x100) || ((uVar2 & 1) == 0)) || (this->indexStorage != STORAGE_USER))
    {
      return true;
    }
  }
  return false;
}

Assistant:

bool DrawTestSpec::valid (void) const
{
	DE_ASSERT(apiType.getProfile() != glu::PROFILE_LAST);
	DE_ASSERT(primitive != PRIMITIVE_LAST);
	DE_ASSERT(drawMethod != DRAWMETHOD_LAST);

	const MethodInfo methodInfo = getMethodInfo(drawMethod);

	for (int ndx = 0; ndx < (int)attribs.size(); ++ndx)
		if (!attribs[ndx].valid(apiType))
			return false;

	if (methodInfo.ranged)
	{
		deUint32 maxIndexValue = 0;
		if (indexType == INDEXTYPE_BYTE)
			maxIndexValue = GLValue::getMaxValue(INPUTTYPE_UNSIGNED_BYTE).ub.getValue();
		else if (indexType == INDEXTYPE_SHORT)
			maxIndexValue = GLValue::getMaxValue(INPUTTYPE_UNSIGNED_SHORT).us.getValue();
		else if (indexType == INDEXTYPE_INT)
			maxIndexValue = GLValue::getMaxValue(INPUTTYPE_UNSIGNED_INT).ui.getValue();
		else
			DE_ASSERT(DE_FALSE);

		if (indexMin > indexMax)
			return false;
		if (indexMin < 0 || indexMax < 0)
			return false;
		if ((deUint32)indexMin > maxIndexValue || (deUint32)indexMax > maxIndexValue)
			return false;
	}

	if (methodInfo.first && first < 0)
		return false;

	// GLES2 limits
	if (apiType == glu::ApiType::es(2,0))
	{
		if (drawMethod != gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS && drawMethod != gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS)
			return false;
		if (drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS && (indexType != INDEXTYPE_BYTE && indexType != INDEXTYPE_SHORT))
			return false;
	}

	// Indirect limitations
	if (methodInfo.indirect)
	{
		// Indirect offset alignment
		if (indirectOffset % 4 != 0)
			return false;

		// All attribute arrays must be stored in a buffer
		for (int ndx = 0; ndx < (int)attribs.size(); ++ndx)
			if (!attribs[ndx].useDefaultAttribute && attribs[ndx].storage == gls::DrawTestSpec::STORAGE_USER)
				return false;
	}
	if (drawMethod == DRAWMETHOD_DRAWELEMENTS_INDIRECT)
	{
		// index offset must be convertable to firstIndex
		if (indexPointerOffset % gls::DrawTestSpec::indexTypeSize(indexType) != 0)
			return false;

		// Indices must be in a buffer
		if (indexStorage != STORAGE_BUFFER)
			return false;
	}

	// Do not allow user pointer in GL core
	if (apiType.getProfile() == glu::PROFILE_CORE)
	{
		if (methodInfo.indexed && indexStorage == DrawTestSpec::STORAGE_USER)
			return false;
	}

	return true;
}